

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::write_array<signed_char>
               (ostream *stream,Read<signed_char> *array,bool is_compressed,bool needs_swapping)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  I64 compressed_bytes;
  int ret;
  Bytef *compressed;
  uLong dest_bytes;
  uLong source_bytes;
  I64 uncompressed_bytes;
  undefined1 local_80 [8];
  HostRead<signed_char> uncompressed;
  Read<signed_char> local_60;
  undefined1 local_50 [8];
  Read<signed_char> swapped;
  LO size;
  bool needs_swapping_local;
  bool is_compressed_local;
  Read<signed_char> *array_local;
  ostream *stream_local;
  int local_10;
  
  if (((ulong)(array->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (int)((array->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (int)((ulong)(array->write_).shared_alloc_.alloc >> 3);
  }
  swapped.write_.shared_alloc_.direct_ptr._0_4_ = local_10;
  swapped.write_.shared_alloc_.direct_ptr._6_1_ = needs_swapping;
  swapped.write_.shared_alloc_.direct_ptr._7_1_ = is_compressed;
  write_value<int>(stream,local_10,needs_swapping);
  Read<signed_char>::Read(&local_60,array);
  swap_bytes<signed_char>
            ((binary *)local_50,&local_60,(bool)(swapped.write_.shared_alloc_.direct_ptr._6_1_ & 1))
  ;
  Read<signed_char>::~Read(&local_60);
  Read<signed_char>::Read((Read<signed_char> *)&uncompressed_bytes,(Read<signed_char> *)local_50);
  HostRead<signed_char>::HostRead
            ((HostRead<signed_char> *)local_80,(Read<signed_char> *)&uncompressed_bytes);
  Read<signed_char>::~Read((Read<signed_char> *)&uncompressed_bytes);
  source_bytes = (uLong)(int)swapped.write_.shared_alloc_.direct_ptr;
  if ((swapped.write_.shared_alloc_.direct_ptr._7_1_ & 1) == 0) {
    pcVar3 = HostRead<signed_char>::data((HostRead<signed_char> *)local_80);
    pcVar3 = nonnull<signed_char_const>(pcVar3);
    std::ostream::write((char *)stream,(long)pcVar3);
  }
  else {
    dest_bytes = source_bytes;
    compressed = (Bytef *)compressBound(source_bytes);
    pvVar2 = operator_new__((ulong)compressed);
    pcVar3 = HostRead<signed_char>::data((HostRead<signed_char> *)local_80);
    pcVar3 = nonnull<signed_char_const>(pcVar3);
    iVar1 = compress2(pvVar2,&compressed,pcVar3,dest_bytes,1);
    if (iVar1 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x87);
    }
    write_value<long>(stream,(long)compressed,
                      (bool)(swapped.write_.shared_alloc_.direct_ptr._6_1_ & 1));
    std::ostream::write((char *)stream,(long)pvVar2);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
  }
  HostRead<signed_char>::~HostRead((HostRead<signed_char> *)local_80);
  Read<signed_char>::~Read((Read<signed_char> *)local_50);
  return;
}

Assistant:

void write_array(std::ostream& stream, Read<T> array, bool is_compressed,
    bool needs_swapping) {
  LO size = array.size();
  write_value(stream, size, needs_swapping);
  Read<T> swapped = swap_bytes(array, needs_swapping);
  HostRead<T> uncompressed(swapped);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    uLong source_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    OMEGA_H_CHECK(ret == Z_OK);
    I64 compressed_bytes = static_cast<I64>(dest_bytes);
    write_value(stream, compressed_bytes, needs_swapping);
    stream.write(reinterpret_cast<const char*>(compressed), compressed_bytes);
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.write(reinterpret_cast<const char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
}